

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyboardConfigTab.cpp
# Opt level: O2

void __thiscall
KeyboardConfigTab::KeyboardConfigTab
          (KeyboardConfigTab *this,PianoInput *input,ShortcutTable *shortcuts,QWidget *parent)

{
  QArrayDataPointer<char16_t> *this_00;
  QVBoxLayout *this_01;
  QLabel *pQVar1;
  QComboBox *pQVar2;
  QGroupBox *pQVar3;
  QVBoxLayout *pQVar4;
  BindingEdit *pBVar5;
  QTreeView *this_02;
  ShortcutTableModel *this_03;
  QHBoxLayout *this_04;
  QKeySequenceEdit *pQVar6;
  QPushButton *pQVar7;
  Bindings *__src;
  undefined4 *puVar8;
  void **ppvVar9;
  KeyboardLayout layout;
  ulong uVar10;
  int *piVar11;
  code *local_c8 [3];
  undefined8 local_b0;
  QTreeView *local_a0;
  QHBoxLayout *local_98;
  QGroupBox *local_90;
  PianoInput *local_88;
  QObject local_80 [8];
  Object local_78 [8];
  QObject local_70 [8];
  QObject local_68 [8];
  QObject local_60 [8];
  Object local_58 [8];
  undefined1 local_50 [32];
  
  ConfigTab::ConfigTab(&this->super_ConfigTab,parent);
  *(undefined ***)&this->super_ConfigTab = &PTR_metaObject_001f19d8;
  *(undefined ***)&(this->super_ConfigTab).field_0x10 = &PTR__KeyboardConfigTab_001f1b88;
  this->mInput = input;
  this->mShortcuts = shortcuts;
  this->mSelectedShortcut = -1;
  local_a0 = (QTreeView *)shortcuts;
  local_88 = input;
  this_01 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(this_01);
  local_98 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(local_98);
  pQVar1 = (QLabel *)operator_new(0x28);
  tr((QString *)local_c8,"Layout:",(char *)0x0,-1);
  QLabel::QLabel(pQVar1,local_c8,0,0);
  QBoxLayout::addWidget(local_98,pQVar1,0,0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
  pQVar2 = (QComboBox *)operator_new(0x28);
  QComboBox::QComboBox(pQVar2,(QWidget *)0x0);
  this->mLayoutCombo = pQVar2;
  QBoxLayout::addWidget(local_98,pQVar2,1,0);
  pQVar3 = (QGroupBox *)operator_new(0x28);
  tr((QString *)local_c8,"Custom layout",(char *)0x0,-1);
  QGroupBox::QGroupBox(pQVar3,(QString *)local_c8,(QWidget *)0x0);
  this->mCustomGroup = pQVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
  pQVar4 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar4);
  pQVar1 = (QLabel *)operator_new(0x28);
  tr((QString *)local_c8,"Assign keys to each note. Press Shift+Del to unbind.",(char *)0x0,-1);
  QLabel::QLabel(pQVar1,local_c8,0,0);
  QBoxLayout::addWidget(pQVar4,pQVar1,0,0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
  pBVar5 = (BindingEdit *)operator_new(0x100);
  BindingEdit::BindingEdit(pBVar5,(QWidget *)0x0);
  this->mBindingEdit = pBVar5;
  QBoxLayout::addWidget(pQVar4,pBVar5,0,0);
  QWidget::setLayout((QLayout *)this->mCustomGroup);
  pQVar3 = (QGroupBox *)operator_new(0x28);
  local_90 = pQVar3;
  tr((QString *)local_c8,"Shortcuts",(char *)0x0,-1);
  QGroupBox::QGroupBox(pQVar3,(QString *)local_c8,(QWidget *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
  pQVar4 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar4);
  this_02 = (QTreeView *)operator_new(0x28);
  QTreeView::QTreeView(this_02,(QWidget *)0x0);
  this_03 = (ShortcutTableModel *)operator_new(0x18);
  ShortcutTableModel::ShortcutTableModel(this_03,(ShortcutTable *)local_a0,(QObject *)this);
  this->mModel = this_03;
  (**(code **)(*(long *)this_02 + 0x1c8))(this_02);
  local_a0 = this_02;
  this_04 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(this_04);
  pQVar6 = (QKeySequenceEdit *)operator_new(0x28);
  QKeySequenceEdit::QKeySequenceEdit(pQVar6,(QWidget *)0x0);
  this->mKeyEdit = pQVar6;
  pQVar7 = (QPushButton *)operator_new(0x28);
  tr((QString *)local_c8,"Clear",(char *)0x0,-1);
  QPushButton::QPushButton(pQVar7,(QString *)local_c8,(QWidget *)0x0);
  this->mClearButton = pQVar7;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
  pQVar7 = (QPushButton *)operator_new(0x28);
  tr((QString *)local_c8,"Default",(char *)0x0,-1);
  QPushButton::QPushButton(pQVar7,(QString *)local_c8,(QWidget *)0x0);
  this->mDefaultButton = pQVar7;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
  pQVar1 = (QLabel *)operator_new(0x28);
  tr((QString *)local_c8,"Keys:",(char *)0x0,-1);
  QLabel::QLabel(pQVar1,local_c8,0);
  QBoxLayout::addWidget(this_04,pQVar1,0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
  QBoxLayout::addWidget(this_04,this->mKeyEdit,1);
  QBoxLayout::addWidget(this_04,this->mClearButton,0);
  QBoxLayout::addWidget(this_04,this->mDefaultButton,0);
  QBoxLayout::addWidget(pQVar4,local_a0,1);
  QBoxLayout::addLayout((QLayout *)pQVar4,(int)this_04);
  QWidget::setLayout((QLayout *)local_90);
  QBoxLayout::addLayout((QLayout *)this_01,(int)local_98);
  QBoxLayout::addWidget(this_01,this->mCustomGroup,0);
  QBoxLayout::addWidget(this_01,local_90,0);
  QBoxLayout::addStretch((int)this_01);
  QWidget::setLayout((QLayout *)this);
  QTreeView::resizeColumnToContents((int)local_a0);
  this_00 = (QArrayDataPointer<char16_t> *)(local_50 + 8);
  for (layout = LayoutQwerty; pQVar2 = this->mLayoutCombo, layout != LayoutCount;
      layout = layout + LayoutQwertz) {
    PianoInput::layoutName((QString *)this_00,layout);
    local_c8[0] = (code *)0x0;
    local_c8[1] = (code *)0x0;
    local_c8[2] = (code *)0x0;
    local_b0 = 2;
    QComboBox::addItem(pQVar2,(QString *)this_00,(QVariant *)local_c8);
    QVariant::~QVariant((QVariant *)local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
  }
  PianoInput::layout(local_88);
  QComboBox::setCurrentIndex((int)pQVar2);
  pQVar3 = this->mCustomGroup;
  PianoInput::layout(local_88);
  QWidget::setEnabled(SUB81(pQVar3,0));
  pBVar5 = this->mBindingEdit;
  __src = PianoInput::bindings(local_88);
  memcpy(&pBVar5->mBindings,__src,0xc4);
  QWidget::update();
  local_c8[0] = ConfigTab::setDirty<(Config::Category)4>;
  local_c8[1] = (code *)0x0;
  QObject::connect<void(BindingEdit::*)(),void(ConfigTab::*)()>
            ((Object *)local_50,(_t)this->mBindingEdit,(Object *)BindingEdit::bindingsChanged,0,
             (ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  local_c8[0] = QKeySequenceEdit::clear;
  local_c8[1] = (code *)0x0;
  uVar10 = 0;
  QObject::connect<void(QAbstractButton::*)(bool),void(QKeySequenceEdit::*)()>
            (local_58,(offset_in_QAbstractButton_to_subr)this->mClearButton,
             (Object *)QAbstractButton::clicked,0,(ConnectionType)this->mKeyEdit);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  pQVar7 = this->mDefaultButton;
  local_c8[0] = QAbstractButton::clicked;
  local_c8[1] = (code *)0x0;
  puVar8 = (undefined4 *)operator_new(0x18);
  *puVar8 = 1;
  *(code **)(puVar8 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/config/tabs/KeyboardConfigTab.cpp:508:9),_0,_QtPrivate::List<>,_void>
       ::impl;
  *(KeyboardConfigTab **)(puVar8 + 4) = this;
  piVar11 = (int *)(uVar10 & 0xffffffff00000000);
  QObject::connectImpl
            (local_60,(void **)pQVar7,(QObject *)local_c8,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar8,piVar11,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  ppvVar9 = (void **)QAbstractItemView::selectionModel();
  local_c8[0] = QItemSelectionModel::selectionChanged;
  local_c8[1] = (code *)0x0;
  puVar8 = (undefined4 *)operator_new(0x18);
  *puVar8 = 1;
  *(code **)(puVar8 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/config/tabs/KeyboardConfigTab.cpp:514:9),_1,_QtPrivate::List<const_QItemSelection_&>,_void>
       ::impl;
  *(KeyboardConfigTab **)(puVar8 + 4) = this;
  piVar11 = (int *)((ulong)piVar11 & 0xffffffff00000000);
  QObject::connectImpl
            (local_68,ppvVar9,(QObject *)local_c8,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar8,piVar11,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  pQVar6 = this->mKeyEdit;
  local_c8[0] = QKeySequenceEdit::keySequenceChanged;
  local_c8[1] = (code *)0x0;
  puVar8 = (undefined4 *)operator_new(0x18);
  *puVar8 = 1;
  *(code **)(puVar8 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/config/tabs/KeyboardConfigTab.cpp:532:9),_1,_QtPrivate::List<const_QKeySequence_&>,_void>
       ::impl;
  *(KeyboardConfigTab **)(puVar8 + 4) = this;
  QObject::connectImpl
            (local_70,(void **)pQVar6,(QObject *)local_c8,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar8,(int *)((ulong)piVar11 & 0xffffffff00000000),(QMetaObject *)0x0)
  ;
  QMetaObject::Connection::~Connection((Connection *)local_70);
  local_c8[0] = ConfigTab::setDirty<(Config::Category)4>;
  local_c8[1] = (code *)0x0;
  uVar10 = 0;
  QObject::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&),void(ConfigTab::*)()>
            (local_78,(offset_in_QAbstractItemModel_to_subr)this->mModel,
             (Object *)QAbstractItemModel::dataChanged,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_78);
  pQVar2 = this->mLayoutCombo;
  local_c8[0] = QComboBox::currentIndexChanged;
  local_c8[1] = (code *)0x0;
  puVar8 = (undefined4 *)operator_new(0x18);
  *puVar8 = 1;
  *(code **)(puVar8 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/config/tabs/KeyboardConfigTab.cpp:541:9),_1,_QtPrivate::List<int>,_void>
       ::impl;
  *(KeyboardConfigTab **)(puVar8 + 4) = this;
  QObject::connectImpl
            (local_80,(void **)pQVar2,(QObject *)local_c8,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar8,(int *)(uVar10 & 0xffffffff00000000),(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_80);
  setKeyEditEnable(this,false);
  return;
}

Assistant:

KeyboardConfigTab::KeyboardConfigTab(PianoInput &input, ShortcutTable &shortcuts, QWidget *parent) :
    ConfigTab(parent),
    mInput(input),
    mShortcuts(shortcuts),
    mSelectedShortcut(-1)
{

    auto layout = new QVBoxLayout;

    auto keyboardLayoutLayout = new QHBoxLayout;
    keyboardLayoutLayout->addWidget(new QLabel(tr("Layout:")));

    mLayoutCombo = new QComboBox;
    keyboardLayoutLayout->addWidget(mLayoutCombo, 1);

    mCustomGroup = new QGroupBox(tr("Custom layout"));
    auto customLayout = new QVBoxLayout;
    customLayout->addWidget(new QLabel(tr("Assign keys to each note. Press Shift+Del to unbind.")));
    mBindingEdit = new BindingEdit;
    customLayout->addWidget(mBindingEdit);
    mCustomGroup->setLayout(customLayout);

    auto shortcutGroup = new QGroupBox(tr("Shortcuts"));
    auto shortcutLayout = new QVBoxLayout;
    auto shortcutView = new QTreeView;
    mModel = new ShortcutTableModel(shortcuts, this);
    shortcutView->setModel(mModel);

    auto shortcutEditLayout = new QHBoxLayout;
    mKeyEdit = new QKeySequenceEdit;
    mClearButton = new QPushButton(tr("Clear"));
    mDefaultButton = new QPushButton(tr("Default"));
    shortcutEditLayout->addWidget(new QLabel(tr("Keys:")));
    shortcutEditLayout->addWidget(mKeyEdit, 1);
    shortcutEditLayout->addWidget(mClearButton);
    shortcutEditLayout->addWidget(mDefaultButton);

    shortcutLayout->addWidget(shortcutView, 1);
    shortcutLayout->addLayout(shortcutEditLayout);
    shortcutGroup->setLayout(shortcutLayout);

    layout->addLayout(keyboardLayoutLayout);
    layout->addWidget(mCustomGroup);
    layout->addWidget(shortcutGroup);
    layout->addStretch(1);
    setLayout(layout);

    // I'd like to have both columns 50/50 and user resizeable but
    // couldn't get it working so just do this for now
    shortcutView->resizeColumnToContents(0);

    for (int kblayout = PianoInput::LayoutQwerty; kblayout < PianoInput::LayoutCount; ++kblayout) {
        mLayoutCombo->addItem(PianoInput::layoutName((PianoInput::KeyboardLayout)kblayout));
    }
    mLayoutCombo->setCurrentIndex(input.layout());

    mCustomGroup->setEnabled(input.layout() == PianoInput::LayoutCustom);
    mBindingEdit->setBindings(input.bindings());

    lazyconnect(mBindingEdit, bindingsChanged, this, setDirty<Config::CategoryKeyboard>);

    lazyconnect(mClearButton, clicked, mKeyEdit, clear);
    connect(mDefaultButton, &QPushButton::clicked, this,
        [this]() {
            // sets the default shortcut for the current selection
            mKeyEdit->setKeySequence(ShortcutTable::getDefault((ShortcutTable::Shortcut)mSelectedShortcut));
        });

    connect(shortcutView->selectionModel(), &QItemSelectionModel::selectionChanged, this,
        [this](QItemSelection const& selected) {
            QSignalBlocker blocker(mKeyEdit); // ignore changed signals for the key edit

            bool hasSelection = !selected.isEmpty();
            setKeyEditEnable(hasSelection);
            if (hasSelection) {
                // get the row of the selection
                mSelectedShortcut = selected.indexes().first().row();
                // update the key edit with this row's key sequence
                mKeyEdit->setKeySequence(mShortcuts.get((ShortcutTable::Shortcut)mSelectedShortcut));
            } else {
                // no selection, clear the edit
                mSelectedShortcut = -1;
                mKeyEdit->clear();
            }
        });

    connect(mKeyEdit, &QKeySequenceEdit::keySequenceChanged, this,
        [this](QKeySequence const& seq) {
            // update the shortcut's sequence in the model
            mModel->setShortcut(mSelectedShortcut, seq);
        });

    // any change made to the model dirties the config
    lazyconnect(mModel, dataChanged, this, setDirty<Config::CategoryKeyboard>);

    connect(mLayoutCombo, qOverload<int>(&QComboBox::currentIndexChanged), this,
        [this](int index) {
            if (index != -1) {
                setDirty<Config::CategoryKeyboard>();
                auto const layout = (PianoInput::KeyboardLayout)index;
                mInput.setLayout(layout);
                mBindingEdit->setBindings(mInput.bindings());
                mCustomGroup->setEnabled(layout == PianoInput::LayoutCustom);
            }
        });

    setKeyEditEnable(false);
}